

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TweakableParser.cpp
# Opt level: O2

Pair<Corrade::Utility::TweakableState,_bool> __thiscall
Corrade::Utility::TweakableParser<bool>::parse(TweakableParser<bool> *this,StringView value)

{
  bool bVar1;
  Debug *pDVar2;
  ushort uVar3;
  ushort uVar4;
  StringView SVar5;
  StringView a;
  StringView a_00;
  Warning WStack_48;
  
  a._sizePlusFlags = value._data;
  SVar5 = Containers::Literals::StringLiterals::operator____s("true",4);
  a._data = (char *)this;
  bVar1 = Containers::operator==(a,SVar5);
  uVar3 = 0x100;
  uVar4 = 1;
  if (!bVar1) {
    SVar5 = Containers::Literals::StringLiterals::operator____s("false",5);
    a_00._sizePlusFlags = (size_t)a._sizePlusFlags;
    a_00._data = (char *)this;
    bVar1 = Containers::operator==(a_00,SVar5);
    if (!bVar1) {
      Warning::Warning(&WStack_48,(Flags)0x0);
      pDVar2 = Debug::operator<<(&WStack_48.super_Debug,"Utility::TweakableParser:");
      SVar5._sizePlusFlags = (size_t)a._sizePlusFlags;
      SVar5._data = (char *)this;
      pDVar2 = Debug::operator<<(pDVar2,SVar5);
      Debug::operator<<(pDVar2,"is not a boolean literal");
      Warning::~Warning(&WStack_48);
      uVar4 = 2;
    }
    uVar3 = 0;
  }
  return (Pair<Corrade::Utility::TweakableState,_bool>)(uVar3 | uVar4);
}

Assistant:

Containers::Pair<TweakableState, bool> TweakableParser<bool>::parse(Containers::StringView value) {
    using namespace Containers::Literals;

    if(value == "true"_s)
        return {TweakableState::Success, true};
    if(value == "false"_s)
        return {TweakableState::Success, false};

    Warning{} << "Utility::TweakableParser:" << value << "is not a boolean literal";
    return {TweakableState::Recompile, {}};
}